

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O1

int Fl_Shared_Image::compare(Fl_Shared_Image **i0,Fl_Shared_Image **i1)

{
  int iVar1;
  Fl_Shared_Image *pFVar2;
  Fl_Shared_Image *pFVar3;
  int iVar4;
  
  pFVar2 = *i0;
  pFVar3 = *i1;
  iVar4 = strcmp(pFVar2->name_,pFVar3->name_);
  if (iVar4 == 0) {
    iVar4 = (pFVar2->super_Fl_Image).w_;
    if (((iVar4 == 0) && (pFVar3->original_ != 0)) ||
       ((iVar1 = (pFVar3->super_Fl_Image).w_, iVar1 == 0 && (pFVar2->original_ != 0)))) {
      iVar4 = 0;
    }
    else {
      iVar4 = iVar4 - iVar1;
      if (iVar4 == 0) {
        iVar4 = (pFVar2->super_Fl_Image).h_ - (pFVar3->super_Fl_Image).h_;
      }
    }
  }
  return iVar4;
}

Assistant:

int
Fl_Shared_Image::compare(Fl_Shared_Image **i0,		// I - First image
                         Fl_Shared_Image **i1) {	// I - Second image
  int i = strcmp((*i0)->name(), (*i1)->name());

  if (i) return i;
  else if (((*i0)->w() == 0 && (*i1)->original_) ||
           ((*i1)->w() == 0 && (*i0)->original_)) return 0;
  else if ((*i0)->w() != (*i1)->w()) return (*i0)->w() - (*i1)->w();
  else return (*i0)->h() - (*i1)->h();
}